

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

list<int,_std::allocator<int>_> * __thiscall
imrt::Station::closed_beamlets_abi_cxx11_(Station *this,int a)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  pair<int,_int> this_00;
  int in_EDX;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *in_RSI;
  key_type *in_RDI;
  int j;
  int i;
  pair<int,_int> aux;
  list<int,_std::allocator<int>_> *ob;
  Collimator *in_stack_ffffffffffffff68;
  _Base_ptr *__x;
  int local_3c;
  pair<int,_int> local_38;
  int local_30;
  pair<int,_int> local_20;
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  local_14 = in_EDX;
  std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)0x142ae5);
  std::pair<int,_int>::pair<int,_int,_true>(&local_20);
  local_30 = 0;
  do {
    iVar1 = local_30;
    iVar2 = Collimator::getXdim((Collimator *)
                                in_RSI[3]._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    if (iVar2 <= iVar1) {
      return (list<int,_std::allocator<int>_> *)in_RDI;
    }
    local_38 = Collimator::getActiveRange(in_stack_ffffffffffffff68,0,0x142b40);
    std::pair<int,_int>::operator=(&local_20,&local_38);
    if (-1 < local_20.first) {
      for (local_3c = local_20.first; local_3c <= local_20.second; local_3c = local_3c + 1) {
        pvVar3 = std::
                 vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                               *)&in_RSI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (long)local_14);
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           (pvVar3,(long)local_30);
        if (local_3c < pvVar4->first) {
LAB_00142c0c:
          __x = &in_RSI[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          this_00 = std::make_pair<int&,int&>((int *)in_stack_ffffffffffffff68,(int *)0x142c2b);
          std::
          map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
          ::operator[](in_RSI,in_RDI);
          std::__cxx11::list<int,_std::allocator<int>_>::push_back
                    ((list<int,_std::allocator<int>_> *)this_00,(value_type_conflict2 *)__x);
        }
        else {
          pvVar3 = std::
                   vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                 *)&in_RSI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                (long)local_14);
          pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                   operator[](pvVar3,(long)local_30);
          if (pvVar4->second < local_3c) goto LAB_00142c0c;
        }
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

list<int> Station::closed_beamlets(int a){
	  list<int> ob;
	  pair <int,int>aux;
    for (int i=0; i < collimator.getXdim(); i++) {
      aux = collimator.getActiveRange(i,angle);
      if (aux.first<0) continue;
      for (int j=aux.first; j<=aux.second; j++)
        if (j<A[a][i].first || j>A[a][i].second)
        	 ob.push_back(pos2beam[make_pair(i,j)]);
    }
    return ob;
  }